

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void assert_solvers_return_equal_cost<int>
               (matrix<int,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<int,_std::allocator<int>_>_>
                *cost_matrix)

{
  undefined8 uVar1;
  bool bVar2;
  size_type sVar3;
  size_type sVar4;
  ostream *poVar5;
  void *pvVar6;
  lazy_ostream *prev;
  basic_cstring<const_char> local_178;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_168;
  basic_cstring<const_char> local_140;
  basic_cstring<const_char> local_130;
  allocator local_119;
  string local_118 [39];
  allocator local_f1;
  string local_f0 [39];
  allocator local_c9;
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [39];
  allocator local_79;
  string local_78 [32];
  int local_58;
  int local_54;
  int local_50;
  int total_cost_brute_force;
  int total_cost;
  undefined1 local_40 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> assignment_brute_force;
  vector<unsigned_long,_std::allocator<unsigned_long>_> assignment;
  matrix<int,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<int,_std::allocator<int>_>_>
  *cost_matrix_local;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             &assignment_brute_force.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_40);
  sVar3 = boost::numeric::ublas::
          matrix<int,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<int,_std::allocator<int>_>_>
          ::size1(cost_matrix);
  sVar4 = boost::numeric::ublas::
          matrix<int,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<int,_std::allocator<int>_>_>
          ::size2(cost_matrix);
  local_50 = hungarian_algorithm::
             solve<int,unsigned_long,boost::numeric::ublas::matrix<int,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<int,std::allocator<int>>>,std::vector<unsigned_long,std::allocator<unsigned_long>>>
                       (cost_matrix,sVar3,sVar4,
                        (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        &assignment_brute_force.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
  sVar3 = boost::numeric::ublas::
          matrix<int,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<int,_std::allocator<int>_>_>
          ::size1(cost_matrix);
  sVar4 = boost::numeric::ublas::
          matrix<int,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<int,_std::allocator<int>_>_>
          ::size2(cost_matrix);
  local_54 = hungarian_algorithm::
             solveBruteForce<int,boost::numeric::ublas::matrix<int,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<int,std::allocator<int>>>,unsigned_long,std::vector<unsigned_long,std::allocator<unsigned_long>>>
                       (cost_matrix,sVar3,sVar4,
                        (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_40);
  if (local_50 != local_54) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"total_cost != total_cost_brute_force:");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<((ostream *)&std::cerr,"  total_cost: ");
    pvVar6 = (void *)std::ostream::operator<<(poVar5,local_50);
    std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<((ostream *)&std::cerr,"  total_cost_brute_force: ");
    pvVar6 = (void *)std::ostream::operator<<(poVar5,local_54);
    std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<((ostream *)&std::cerr,"  cost_matrix: [");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    local_58 = (int)std::setw(3);
    std::operator<<(poVar5,(_Setw)local_58);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"    ",&local_79);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a0,", ",&local_a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c8,";\n",&local_c9);
    print_matrix<int>((ostream *)&std::cerr,cost_matrix,(string *)local_78,(string *)local_a0,
                      (string *)local_c8);
    std::__cxx11::string::~string(local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    std::__cxx11::string::~string(local_a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    poVar5 = std::operator<<((ostream *)&std::cerr,"  ]");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<((ostream *)&std::cerr,"  Hungarian assignment:");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f0,"    ",&local_f1);
    print_assignment<int>
              ((ostream *)&std::cerr,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               &assignment_brute_force.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,cost_matrix,(string *)local_f0);
    std::__cxx11::string::~string(local_f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_f1);
    poVar5 = std::operator<<((ostream *)&std::cerr,"  brute force assignment:");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_118,"    ",&local_119);
    print_assignment<int>
              ((ostream *)&std::cerr,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_40,cost_matrix,
               (string *)local_118);
    std::__cxx11::string::~string(local_118);
    std::allocator<char>::~allocator((allocator<char> *)&local_119);
  }
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_130,
               "/workspace/llm4binary/github/license_all_cmakelists_25/abuchegger[P]hungarian-algorithm-cpp/test.cpp"
               ,100);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_140);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_130,0xcd,&local_140);
    prev = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_168,prev,(char (*) [1])0x140372);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_178,
               "/workspace/llm4binary/github/license_all_cmakelists_25/abuchegger[P]hungarian-algorithm-cpp/test.cpp"
               ,100);
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_168,&local_178,0xcd,1,2,&local_50,"total_cost",&local_54,
               "total_cost_brute_force");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_168);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_40);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             &assignment_brute_force.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void assert_solvers_return_equal_cost(const ublas::matrix<Cost>& cost_matrix)
{
  std::vector<std::size_t> assignment, assignment_brute_force;
  const Cost total_cost = hungarian_algorithm::solve<Cost>(
    cost_matrix, cost_matrix.size1(), cost_matrix.size2(), assignment);
  const Cost total_cost_brute_force = hungarian_algorithm::solveBruteForce<Cost>(
    cost_matrix, cost_matrix.size1(), cost_matrix.size2(), assignment_brute_force);
  if (total_cost != total_cost_brute_force)
  {
    std::cerr << "total_cost != total_cost_brute_force:" << std::endl;
    std::cerr << "  total_cost: " << total_cost << std::endl;
    std::cerr << "  total_cost_brute_force: " << total_cost_brute_force << std::endl;
    std::cerr << "  cost_matrix: [" << std::endl << std::setw(3);
    print_matrix(std::cerr, cost_matrix, "    ");
    std::cerr << "  ]" << std::endl;
    std::cerr << "  Hungarian assignment:" << std::endl;
    print_assignment(std::cerr, assignment, cost_matrix, "    ");
    std::cerr << "  brute force assignment:" << std::endl;
    print_assignment(std::cerr, assignment_brute_force, cost_matrix, "    ");
  }
  BOOST_CHECK_EQUAL(total_cost, total_cost_brute_force);
}